

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceOptions::SerializeWithCachedSizes
          (ServiceOptions *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  UninterpretedOption *value;
  UnknownFieldSet *pUVar3;
  int local_1c;
  int i;
  CodedOutputStream *output_local;
  ServiceOptions *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = uninterpreted_option_size(this);
    if (iVar2 <= local_1c) break;
    value = uninterpreted_option(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value,output);
    local_1c = local_1c + 1;
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void ServiceOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}